

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.c
# Opt level: O0

void setup_cache_memcached(SSL_CTX **contexts,size_t num_contexts)

{
  h2o_memcached_context_t *memc;
  size_t local_28;
  size_t i;
  h2o_memcached_context_t *memc_ctx;
  size_t num_contexts_local;
  SSL_CTX **contexts_local;
  
  memc = h2o_memcached_create_context
                   (conf.memcached.host,conf.memcached.port,conf.memcached.text_protocol,
                    conf.cache.vars.memcached.num_threads,conf.cache.vars.memcached.prefix);
  h2o_accept_setup_async_ssl_resumption(memc,conf.lifetime);
  for (local_28 = 0; local_28 != num_contexts; local_28 = local_28 + 1) {
    SSL_CTX_ctrl((SSL_CTX *)contexts[local_28],0x2c,0x82,(void *)0x0);
    SSL_CTX_set_timeout((SSL_CTX *)contexts[local_28],(ulong)conf.lifetime);
    h2o_socket_ssl_async_resumption_setup_ctx(contexts[local_28]);
  }
  spawn_cache_cleanup_thread(contexts,num_contexts);
  return;
}

Assistant:

static void setup_cache_memcached(SSL_CTX **contexts, size_t num_contexts)
{
    h2o_memcached_context_t *memc_ctx =
        h2o_memcached_create_context(conf.memcached.host, conf.memcached.port, conf.memcached.text_protocol,
                                     conf.cache.vars.memcached.num_threads, conf.cache.vars.memcached.prefix);
    h2o_accept_setup_async_ssl_resumption(memc_ctx, conf.lifetime);
    size_t i;
    for (i = 0; i != num_contexts; ++i) {
        SSL_CTX_set_session_cache_mode(contexts[i], SSL_SESS_CACHE_SERVER | SSL_SESS_CACHE_NO_AUTO_CLEAR);
        SSL_CTX_set_timeout(contexts[i], conf.lifetime);
        h2o_socket_ssl_async_resumption_setup_ctx(contexts[i]);
    }
    spawn_cache_cleanup_thread(contexts, num_contexts);
}